

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void writeRaw(FILE *outf,char *groupname,dotNode *(*results) [7],float probeRad,char *label,
             float density,int conFlag)

{
  float fVar1;
  atom *src;
  atom *targ;
  residue_t *prVar2;
  dotNode_t *pdVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  float local_80;
  float local_7c;
  float local_78;
  
  for (lVar6 = 0; lVar6 != 0x72; lVar6 = lVar6 + 1) {
    for (uVar7 = 0; uVar7 != 7; uVar7 = uVar7 + 1) {
      if (results[lVar6][uVar7] == (dotNode *)0x0) {
        pdVar3 = (dotNode *)0x0;
      }
      else {
        pdVar3 = Condense(results[lVar6][uVar7],conFlag);
        results[lVar6][uVar7] = pdVar3;
      }
      for (; pdVar3 != (dotNode *)0x0; pdVar3 = pdVar3->next) {
        fprintf((FILE *)outf,"%s:%s:%s:",label,groupname,
                &DAT_0013d988 + *(int *)(&DAT_0013d988 + uVar7 * 4));
        src = pdVar3->a;
        targ = pdVar3->t;
        prVar2 = src->r;
        fprintf((FILE *)outf,"%s%4.4s%c%s %s%c:",prVar2->chain,prVar2->Hy36resno,
                (ulong)(uint)(int)prVar2->resInsCode,prVar2->resname,src->atomname,
                (ulong)(uint)(int)src->altConf);
        if (targ == (atom *)0x0) {
          fwrite(":::::::",7,1,(FILE *)outf);
        }
        else {
          prVar2 = targ->r;
          fprintf((FILE *)outf,"%s%4.4s%c%s %s%c:",prVar2->chain,prVar2->Hy36resno,
                  (ulong)(uint)(int)prVar2->resInsCode,prVar2->resname,targ->atomname,
                  (ulong)(uint)(int)targ->altConf);
          fVar8 = gapSize(&src->loc,&targ->loc,src->radius + targ->radius);
          fVar1 = pdVar3->gap;
          if (OldStyleU == '\x01') {
            local_78 = kissEdge2bullsEye(src->radius,targ->radius,probeRad);
            local_7c = dot2bullsEye(&pdVar3->loc,src,targ);
            local_80 = dot2srcCenter(&pdVar3->loc,src,targ);
          }
          dVar9 = v3distance(&pdVar3->loc,&pdVar3->spike);
          switch(uVar7 & 0xffffffff) {
          case 0:
          case 1:
            dVar10 = (double)(fVar1 / GAPweight);
            exp(-dVar10 * dVar10);
            break;
          case 2:
          case 3:
          case 4:
          case 5:
            break;
          case 6:
          }
          if (conFlag == 0) {
            if (LOneDotEach == '\x01') {
              fprintf((FILE *)outf,"%.2f:",(double)pdVar3->angle);
            }
          }
          else {
            fprintf((FILE *)outf,"%i:",(ulong)(uint)pdVar3->dotCount);
          }
          if (OldStyleU == '\x01') {
            dVar10 = (double)local_78;
            dVar11 = (double)local_7c;
            dVar12 = (double)local_80;
          }
          else {
            dVar10 = (pdVar3->spike).x;
            dVar11 = (pdVar3->spike).y;
            dVar12 = (pdVar3->spike).z;
          }
          fprintf((FILE *)outf,"%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",(double)fVar8,(double)fVar1,
                  dVar10,dVar11,dVar12,(double)(float)dVar9);
        }
        pcVar4 = getAtomName((int)lVar6);
        if (targ == (atom *)0x0) {
          fprintf((FILE *)outf,":%s:%s:%.3f:%.3f:%.3f",(pdVar3->loc).x,(pdVar3->loc).y,
                  (pdVar3->loc).z,pcVar4,"");
          fprintf((FILE *)outf,":%.2f:\n",(double)src->bval);
        }
        else {
          pcVar5 = getAtomName(targ->atomclass);
          fprintf((FILE *)outf,":%s:%s:%.3f:%.3f:%.3f",(pdVar3->loc).x,(pdVar3->loc).y,
                  (pdVar3->loc).z,pcVar4,pcVar5);
          fprintf((FILE *)outf,":%.2f:%.2f\n",(double)src->bval,(double)targ->bval);
        }
      }
    }
  }
  return;
}

Assistant:

void writeRaw(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
	       float probeRad, char* label, float density, int conFlag) //conFlag added SJ 10/07/2011
{
   int i, j;
   dotNode *node;
   atom *a, *t;
  // char *mast[NODEWIDTH] = {"wc", "cc", "so", "bo", "hb"};
   char *mast[NODEWIDTH] = {"wc","cc","wh","so","bo","wo","hb"}; /* 04/10/2015 SJ to changed to match new categories of weak H bonds and worse overlap (these lists are made only if LweakHbonds and LworseOverlap are true respectively). see NODEWIDTH probe.h*/
   
   float gap, sl, dtgp, ke2be, d2be, d2sc, score;
   double scaledGap;
   for (i = 0; i < NUMATOMTYPES; i++)
   {/*loop over NUMATOMTYPES*/

      for (j = 0; j < NODEWIDTH; j++)
      {/*loop over NODEWIDTH*/

         node = results[i][j];
         if(node) // added 10/05/11 - SJ for condensing rawOutput
         {
             node = Condense(node,conFlag);
             results[i][j]=node;
         }
         while(node)
         {/*while node...*/
             fprintf(outf, "%s:%s:%s:", label, groupname, mast[j]);
             a = node->a;
             t = node->t;
             
             fprintf(outf, "%s%4.4s%c%s %s%c:",
                     a->r->chain, a->r->Hy36resno, a->r->resInsCode,
                     a->r->resname,a->atomname, a->altConf);
             
             if(t)
             {/*t node exists*/
                 fprintf(outf, "%s%4.4s%c%s %s%c:",
                         t->r->chain, t->r->Hy36resno, t->r->resInsCode,
                         t->r->resname,t->atomname, t->altConf);
                 gap = gapSize(&(a->loc), &(t->loc),(a->radius + t->radius));
                 dtgp = node->gap;
                 if (OldStyleU)
                 {
                     ke2be = kissEdge2bullsEye(a->radius, t->radius, probeRad);
                     d2be = dot2bullsEye(&(node->loc), a, t);
                     d2sc = dot2srcCenter(&(node->loc), a, t);
                 }
                 sl = gapSize(&(node->loc), &(node->spike), 0.0);
                 score = 0.0;
                 switch(j) /* SJ 04/10/2015 changed to include new categories*/
                 {
                    case 0:
                    case 1:
                           scaledGap = dtgp/GAPweight;
                           score = exp(-scaledGap*scaledGap);
                           break;
                    case 2: /* TODO: SJ weak H bonds, don't know what to do here, because they can be both wc and cc, so will have to check*/
                    case 3: /* small overlap, doing nothing, as before*/
                    case 4: score = -BUMPweight * sl; break;
                    case 5: score = -BUMPweight * sl; break; /* worse overlap, same as bad overlap*/
                    case 6: score =    HBweight * sl; break;
                 }
                 if(conFlag)
                 {
                      fprintf(outf,"%i:",node->dotCount);
                 }
                 else if(LOneDotEach)  /*dcr20120120*/
                 {
                      fprintf(outf,"%.2f:",node->angle);
                 }
                 if (OldStyleU)
                 {
                     fprintf(outf, "%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                             gap, dtgp, ke2be, d2be, d2sc, sl, score/density);
                 }
                 else
                 {
                     fprintf(outf, "%.3f:%.3f:%.3f:%.3f:%.3f:%.3f:%.4f",
                             gap, dtgp, node->spike.x, node->spike.y,
                             node->spike.z, sl, score/density);
                 }
             }/*t node exists*/
             else
             {
                 fprintf(outf, ":::::::");
             }

             fprintf(outf,":%s:%s:%.3f:%.3f:%.3f",
                         getAtomName(i),(t?getAtomName(t->atomclass):""),
                         node->loc.x,node->loc.y,node->loc.z);

             if(t)
             {
                 fprintf(outf, ":%.2f:%.2f\n", a->bval, t->bval);
             }
             else
             {
                 fprintf(outf, ":%.2f:\n", a->bval);
             }
             node = node->next;
         }/*while node...*/
      }/*loop over NODEWIDTH*/
   }/*loop over NUMATOMTYPES*/
}